

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O1

int av1_return_max_sub_pixel_mv
              (MACROBLOCKD *xd,AV1_COMMON *cm,SUBPEL_MOTION_SEARCH_PARAMS *ms_params,MV start_mv,
              FULLPEL_MV_STATS *start_mv_stats,MV *bestmv,int *distortion,uint *sse1,
              int_mv *last_mv_search_list)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  
  iVar3 = ms_params->allow_hp;
  uVar1 = (ushort)(ms_params->mv_limits).row_max;
  bestmv->row = uVar1;
  uVar2 = (ushort)(ms_params->mv_limits).col_max;
  bestmv->col = uVar2;
  if (iVar3 == 0) {
    if ((uVar1 & 1) != 0) {
      bestmv->row = uVar1 + (ushort)((short)uVar1 < 1) * 2 + -1;
    }
    if ((uVar2 & 1) != 0) {
      bestmv->col = uVar2 + (ushort)((short)uVar2 < 1) * 2 + -1;
    }
  }
  *sse1 = 0;
  return 0;
}

Assistant:

int av1_return_max_sub_pixel_mv(MACROBLOCKD *xd, const AV1_COMMON *const cm,
                                const SUBPEL_MOTION_SEARCH_PARAMS *ms_params,
                                MV start_mv,
                                const FULLPEL_MV_STATS *start_mv_stats,
                                MV *bestmv, int *distortion, unsigned int *sse1,
                                int_mv *last_mv_search_list) {
  (void)xd;
  (void)cm;
  (void)start_mv;
  (void)start_mv_stats;
  (void)distortion;
  (void)last_mv_search_list;

  const int allow_hp = ms_params->allow_hp;
  const SubpelMvLimits *mv_limits = &ms_params->mv_limits;

  bestmv->row = mv_limits->row_max;
  bestmv->col = mv_limits->col_max;

  unsigned int besterr = 0;

  // In the sub-pel motion search, if hp is not used, then the last bit of mv
  // has to be 0.
  lower_mv_precision(bestmv, allow_hp, 0);
  *sse1 = besterr;
  return besterr;
}